

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

int nn_global_hold_socket_locked(nn_sock **sockp,int s)

{
  int iVar1;
  int iVar2;
  nn_sock *self;
  
  iVar2 = -0x9523dfd;
  if ((::self.socks == (nn_sock **)0x0) || (((byte)::self.flags & 1) != 0)) {
    self = (nn_sock *)0x0;
  }
  else {
    if (0x1ff < (uint)s) {
      return -9;
    }
    self = ::self.socks[(uint)s];
    if (self == (nn_sock *)0x0) {
      return -9;
    }
    iVar1 = nn_sock_hold(self);
    iVar2 = 0;
    if (iVar1 != 0) {
      return -9;
    }
  }
  *sockp = self;
  return iVar2;
}

Assistant:

int nn_global_hold_socket_locked(struct nn_sock **sockp, int s)
{
    struct nn_sock *sock;

    if (nn_slow (self.socks == NULL)) {
        *sockp = NULL;
        return -ETERM;
    }
    if (nn_slow ((self.flags & NN_CTX_FLAG_ZOMBIE) != 0)) {
        *sockp = NULL;
        return -ETERM;
    }

    if (nn_slow (s < 0 || s >= NN_MAX_SOCKETS))
        return -EBADF;

    sock = self.socks[s];
    if (nn_slow (sock == NULL))
        return -EBADF;

    if (nn_slow (nn_sock_hold (sock) != 0)) {
        return -EBADF;
    }
    *sockp = sock;
    return 0;
}